

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableFormatter.cpp
# Opt level: O0

void __thiscall
cali::TableFormatter::TableFormatter(TableFormatter *this,string *fields,string *sort_fields)

{
  TableImpl *this_00;
  element_type *this_01;
  string *sort_fields_local;
  string *fields_local;
  TableFormatter *this_local;
  
  Formatter::Formatter(&this->super_Formatter);
  (this->super_Formatter)._vptr_Formatter = (_func_int **)&PTR__TableFormatter_0054ece8;
  this_00 = (TableImpl *)operator_new(0xc0);
  TableImpl::TableImpl(this_00);
  std::shared_ptr<cali::TableFormatter::TableImpl>::shared_ptr<cali::TableFormatter::TableImpl,void>
            (&this->mP,this_00);
  this_01 = std::
            __shared_ptr_access<cali::TableFormatter::TableImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cali::TableFormatter::TableImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mP);
  TableImpl::parse(this_01,fields,sort_fields);
  return;
}

Assistant:

TableFormatter::TableFormatter(const std::string& fields, const std::string& sort_fields) : mP { new TableImpl }
{
    mP->parse(fields, sort_fields);
}